

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O0

void __thiscall
gpu::shared_device_buffer::read2D
          (shared_device_buffer *this,size_t spitch,void *dst,size_t dpitch,size_t width,
          size_t height)

{
  Type TVar1;
  element_type *this_00;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  Context local_c8;
  size_t region [3];
  size_t sStack_98;
  size_t host_origin [3];
  size_t local_78;
  size_t buffer_origin [3];
  undefined1 local_50 [8];
  Context context;
  size_t height_local;
  size_t width_local;
  size_t dpitch_local;
  void *dst_local;
  size_t spitch_local;
  shared_device_buffer *this_local;
  
  context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)height;
  if ((spitch == width) && (dpitch == width)) {
    read(this,(int)dst,(void *)(width * height),0);
  }
  else {
    Context::Context((Context *)local_50);
    TVar1 = Context::type((Context *)local_50);
    if (TVar1 == TypeOpenCL) {
      local_78 = this->offset_;
      buffer_origin[0] = 0;
      buffer_origin[1] = 0;
      sStack_98 = 0;
      host_origin[0] = 0;
      host_origin[1] = 0;
      region[0] = (size_t)context.data_ref_.
                          super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
      region[1] = 1;
      local_c8.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)width;
      Context::cl(&local_c8);
      this_00 = std::
                __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_c8);
      ocl::OpenCLEngine::readBufferRect
                (this_00,(cl_mem)this->data_,1,&local_78,&sStack_98,
                 (size_t *)
                 &local_c8.data_ref_.
                  super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 spitch,0,dpitch,0,dst);
      std::shared_ptr<ocl::OpenCLEngine>::~shared_ptr((shared_ptr<ocl::OpenCLEngine> *)&local_c8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/shared_device_buffer.cpp"
                 ,&local_e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_110,"No GPU context!",&local_111);
      raiseException(&local_e8,0x158,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
    Context::~Context((Context *)local_50);
  }
  return;
}

Assistant:

void shared_device_buffer::read2D(size_t spitch, void *dst, size_t dpitch, size_t width, size_t height) const
{
	if (spitch == width && dpitch == width) {
		read(dst, width * height);
		return;
	}

	Context context;
	switch (context.type()) {
#ifdef CUDA_SUPPORT
		case Context::TypeCUDA:
			CUDA_SAFE_CALL(cudaMemcpy2D(dst, dpitch, cuptr(), spitch, width, height, cudaMemcpyDeviceToHost));
			break;
#endif
		case Context::TypeOpenCL:
		{
			size_t buffer_origin[3] = { offset_, 0, 0 };
			size_t host_origin[3] = { 0, 0, 0 };
			size_t region[3] = { width, height, 1 };
			context.cl()->readBufferRect((cl_mem) data_, CL_TRUE, buffer_origin, host_origin, region, spitch, 0, dpitch, 0, dst);
		}
			break;
		default:
			gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}
}